

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::TiledInputFile::readTiles
          (TiledInputFile *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 uVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  stringstream _iex_replace_s;
  BaseExc *e;
  stringstream _iex_throw_s;
  int in_stack_0000033c;
  int in_stack_00000340;
  int in_stack_00000344;
  int in_stack_00000348;
  int in_stack_0000034c;
  Data *in_stack_00000350;
  int in_stack_00000360;
  undefined4 in_stack_fffffffffffffc58;
  undefined4 in_stack_fffffffffffffc5c;
  int in_stack_fffffffffffffc60;
  int in_stack_fffffffffffffc64;
  TiledInputFile *in_stack_fffffffffffffc68;
  stringstream local_1b8 [16];
  ostream local_1a8 [396];
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c [3];
  
  local_1c = in_R9D;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_EDX;
  local_c[0] = in_ESI;
  bVar1 = isValidLevel(in_stack_fffffffffffffc68,in_stack_fffffffffffffc64,in_stack_fffffffffffffc60
                      );
  if (!bVar1) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar2 = std::operator<<(local_1a8,"Level coordinate (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1c);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_stack_00000008);
    std::operator<<(poVar2,") is invalid.");
    uVar3 = __cxa_allocate_exception(0x48);
    Iex_3_3::ArgExc::ArgExc
              ((ArgExc *)CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
               (stringstream *)CONCAT44(in_stack_fffffffffffffc5c,in_stack_fffffffffffffc58));
    __cxa_throw(uVar3,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
  }
  if (local_10 < local_c[0]) {
    std::swap<int>(local_c,&local_10);
  }
  if (local_18 < local_14) {
    std::swap<int>(&local_14,&local_18);
  }
  std::__shared_ptr_access<Imf_3_3::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<Imf_3_3::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x328523);
  Data::readTiles(in_stack_00000350,in_stack_0000034c,in_stack_00000348,in_stack_00000344,
                  in_stack_00000340,in_stack_0000033c,in_stack_00000360);
  return;
}

Assistant:

void
TiledInputFile::readTiles (int dx1, int dx2, int dy1, int dy2, int lx, int ly)
{
    //
    // Read a range of tiles from the file into the framebuffer
    //

    try
    {
        if (!isValidLevel (lx, ly))
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Level coordinate "
                "(" << lx
                    << ", " << ly
                    << ") "
                       "is invalid.");

        if (dx1 > dx2) std::swap (dx1, dx2);
        if (dy1 > dy2) std::swap (dy1, dy2);

        _data->readTiles (dx1, dx2, dy1, dy2, lx, ly);
    }
    catch (IEX_NAMESPACE::BaseExc& e)
    {
        REPLACE_EXC (
            e,
            "Error reading pixel data from image "
            "file \""
                << fileName () << "\". " << e.what ());
        throw;
    }
}